

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_graph_get_tensor(ggml_cgraph *cgraph,char *name)

{
  ggml_tensor *pgVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)cgraph->n_leafs;
  if (cgraph->n_leafs < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar5 == uVar4) {
      uVar2 = cgraph->n_nodes;
      if (cgraph->n_nodes < 1) {
        uVar2 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar2 == uVar5) {
          return (ggml_tensor *)0x0;
        }
        pgVar1 = cgraph->nodes[uVar5];
        iVar3 = strcmp(pgVar1->name,name);
        uVar5 = uVar5 + 1;
      } while (iVar3 != 0);
      return pgVar1;
    }
    pgVar1 = cgraph->leafs[uVar4];
    iVar3 = strcmp(pgVar1->name,name);
    uVar4 = uVar4 + 1;
  } while (iVar3 != 0);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_graph_get_tensor(const struct ggml_cgraph * cgraph, const char * name) {
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * leaf = cgraph->leafs[i];

        if (strcmp(leaf->name, name) == 0) {
            return leaf;
        }
    }

    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (strcmp(node->name, name) == 0) {
            return node;
        }
    }

    return NULL;
}